

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_DonateEmptyCordBuffer_Test::
~CordOutputStreamTest_DonateEmptyCordBuffer_Test
          (CordOutputStreamTest_DonateEmptyCordBuffer_Test *this)

{
  CordOutputStreamTest_DonateEmptyCordBuffer_Test *this_local;
  
  ~CordOutputStreamTest_DonateEmptyCordBuffer_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CordOutputStreamTest, DonateEmptyCordBuffer) {
  absl::CordBuffer buffer = absl::CordBuffer::CreateWithDefaultLimit(500);
  absl::Span<char> available = buffer.available();
  void* available_data = available.data();
  CordOutputStream output(std::move(buffer));
  void* data;
  int size;
  EXPECT_TRUE(output.Next(&data, &size));
  EXPECT_EQ(data, available_data);
  EXPECT_EQ(size, static_cast<int>(available.size()));
  memset(data, 'a', static_cast<size_t>(size));

  absl::Cord cord = output.Consume();
  ASSERT_TRUE(cord.TryFlat());
  absl::string_view flat = *cord.TryFlat();
  EXPECT_EQ(flat, std::string(static_cast<size_t>(size), 'a'));
  EXPECT_EQ(flat.data(), available_data);
}